

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

Fl_Widget * __thiscall Fl_Widget_Type::enter_live_mode(Fl_Widget_Type *this,int param_1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  int param_1_local;
  Fl_Widget_Type *this_local;
  
  uVar1 = Fl_Widget::x(this->o);
  uVar2 = Fl_Widget::y(this->o);
  uVar3 = Fl_Widget::w(this->o);
  uVar4 = Fl_Widget::h(this->o);
  iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x29])
                    (this,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  this->live_widget = (Fl_Widget *)CONCAT44(extraout_var,iVar5);
  if (this->live_widget != (Fl_Widget *)0x0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x15])();
  }
  return this->live_widget;
}

Assistant:

Fl_Widget *Fl_Widget_Type::enter_live_mode(int) {
  live_widget = widget(o->x(), o->y(), o->w(), o->h());
  if (live_widget)
    copy_properties();
  return live_widget;
}